

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall foxxll::config::initialize(config *this)

{
  string local_1a0 [32];
  Logger local_180;
  
  tlx::Logger::Logger(&local_180);
  get_version_string_long_abi_cxx11_();
  std::operator<<((ostream *)&local_180,local_1a0);
  std::__cxx11::string::~string(local_1a0);
  tlx::Logger::~Logger(&local_180);
  print_library_version_mismatch();
  this->first_flash = 0;
  if ((this->disks_list).
      super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->disks_list).
      super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
      super__Vector_impl_data._M_start) {
    (*this->_vptr_config[2])(this);
  }
  this->max_device_id_ = 0;
  this->is_initialized = true;
  return;
}

Assistant:

void config::initialize()
{
    TLX_LOG1 << get_version_string_long();
    print_library_version_mismatch();

    first_flash = 0;

    // if disks_list is empty, then try to load disk configuration files
    if (disks_list.size() == 0)
    {
        find_config();
    }

    max_device_id_ = 0;

    is_initialized = true;
}